

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathStringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlXPathObjectPtr pxVar3;
  int iVar4;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar4 = ctxt->valueNr;
    if ((long)iVar4 < 1) {
      iVar4 = 0x17;
    }
    else {
      iVar1 = iVar4 + -1;
      ctxt->valueNr = iVar1;
      if (iVar4 == 1) {
        pxVar3 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar3 = ctxt->valueTab[(long)iVar4 + -2];
      }
      ctxt->value = pxVar3;
      pxVar3 = ctxt->valueTab[iVar1];
      ctxt->valueTab[iVar1] = (xmlXPathObjectPtr)0x0;
      if (pxVar3 != (xmlXPathObjectPtr)0x0) {
        if (pxVar3->type != XPATH_STRING) {
          pxVar2 = xmlXPathCastToString(pxVar3);
          if (pxVar2 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar3);
          pxVar3 = xmlXPathCacheWrapString(ctxt,pxVar2);
        }
        goto LAB_001c45ca;
      }
      iVar4 = 10;
    }
  }
  else {
    if (nargs == 0) {
      pxVar2 = xmlNodeGetContent(ctxt->context->node);
      if (pxVar2 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      pxVar3 = xmlXPathCacheWrapString(ctxt,pxVar2);
LAB_001c45ca:
      valuePush(ctxt,pxVar3);
      return;
    }
    iVar4 = 0xc;
  }
  xmlXPathErr(ctxt,iVar4);
  return;
}

Assistant:

void
xmlXPathStringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    xmlChar *stringval;

    if (ctxt == NULL) return;
    if (nargs == 0) {
        stringval = xmlXPathCastNodeToString(ctxt->context->node);
        if (stringval == NULL)
            xmlXPathPErrMemory(ctxt);
        valuePush(ctxt, xmlXPathCacheWrapString(ctxt, stringval));
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if (cur->type != XPATH_STRING) {
        stringval = xmlXPathCastToString(cur);
        if (stringval == NULL)
            xmlXPathPErrMemory(ctxt);
        xmlXPathReleaseObject(ctxt->context, cur);
        cur = xmlXPathCacheWrapString(ctxt, stringval);
    }
    valuePush(ctxt, cur);
}